

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

Matrix44<float> *
Imath_2_5::addOffset<float>
          (Matrix44<float> *inMat,Vec3<float> *tOffset,Vec3<float> *rOffset,Vec3<float> *sOffset,
          Matrix44<float> *ref)

{
  float fVar1;
  float *pfVar2;
  Vec3<float> *in_RCX;
  Vec3<float> *in_RDX;
  Matrix44<float> *in_RDI;
  Matrix44<float> S;
  Vec3<float> _rOffset;
  Matrix44<float> O;
  Matrix44<float> *X;
  Vec3<float> *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  float fVar3;
  Matrix44<float> *this;
  Vec3<float> local_7c;
  Vec3<float> local_70 [2];
  Vec3<float> *in_stack_ffffffffffffffa8;
  Matrix44<float> *in_stack_ffffffffffffffb0;
  
  this = in_RDI;
  Matrix44<float>::Matrix44
            ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  Vec3<float>::Vec3(&local_7c,in_RCX);
  Vec3<float>::operator*=(&local_7c,0.017453292);
  Matrix44<float>::rotate<float>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pfVar2 = Vec3<float>::operator[](in_RDX,0);
  fVar3 = *pfVar2;
  pfVar2 = Matrix44<float>::operator[]((Matrix44<float> *)local_70,3);
  *pfVar2 = fVar3;
  pfVar2 = Vec3<float>::operator[](in_RDX,1);
  fVar1 = *pfVar2;
  pfVar2 = Matrix44<float>::operator[]((Matrix44<float> *)local_70,3);
  pfVar2[1] = fVar1;
  pfVar2 = Vec3<float>::operator[](in_RDX,2);
  fVar1 = *pfVar2;
  pfVar2 = Matrix44<float>::operator[]((Matrix44<float> *)local_70,3);
  pfVar2[2] = fVar1;
  Matrix44<float>::Matrix44((Matrix44<float> *)CONCAT44(fVar3,in_stack_fffffffffffffea0));
  Matrix44<float>::scale<float>
            ((Matrix44<float> *)CONCAT44(fVar3,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98)
  ;
  Matrix44<float>::operator*(this,in_RDI);
  Matrix44<float>::operator*(this,in_RDI);
  Matrix44<float>::operator*(this,in_RDI);
  return this;
}

Assistant:

Matrix44<T>
addOffset( const Matrix44<T>& inMat,
           const Vec3<T>&     tOffset,
           const Vec3<T>&     rOffset,
           const Vec3<T>&     sOffset,
           const Matrix44<T>& ref)
{
    Matrix44<T> O;

    Vec3<T> _rOffset(rOffset);
    _rOffset *= M_PI / 180.0;
    O.rotate (_rOffset);

    O[3][0] = tOffset[0];
    O[3][1] = tOffset[1];
    O[3][2] = tOffset[2];

    Matrix44<T> S;
    S.scale (sOffset);

    Matrix44<T> X = S * O * inMat * ref;

    return X;
}